

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::getTimingTagsMemfill
          (CLIntercept *this,char *functionName,cl_command_queue queue,void *dst,size_t size,
          string *hostTag,string *deviceTag)

{
  CLdispatchX *pCVar1;
  cl_icd_dispatch *pcVar2;
  SConfig *pSVar3;
  void *in_RCX;
  cl_command_queue in_RDX;
  char *in_RSI;
  CLIntercept *in_RDI;
  long in_R8;
  string *in_R9;
  string *in_stack_00000008;
  char s [256];
  cl_unified_shared_memory_type_intel dstType;
  cl_context context;
  CLdispatchX *dispatchX;
  cl_platform_id platform;
  lock_guard<std::mutex> lock;
  string *in_stack_000003f8;
  cl_platform_id in_stack_00000400;
  CLIntercept *in_stack_00000408;
  mutex_type *in_stack_fffffffffffffe18;
  char *__s;
  lock_guard<std::mutex> *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  CLIntercept *in_stack_fffffffffffffe30;
  CLIntercept *in_stack_fffffffffffffe38;
  char local_198 [268];
  int local_8c;
  cl_context local_88;
  CLdispatchX *local_80;
  allocator local_71;
  string local_70 [48];
  cl_platform_id local_40;
  string *local_30;
  long local_28;
  void *local_20;
  cl_command_queue local_18;
  char *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_40 = getPlatform(in_stack_fffffffffffffe30,
                         (cl_command_queue)
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  pCVar1 = CLIntercept::dispatchX
                     (in_stack_fffffffffffffe38,(cl_platform_id)in_stack_fffffffffffffe30);
  if (pCVar1->clGetMemAllocInfoINTEL ==
      (_func_cl_int_cl_context_void_ptr_cl_mem_info_intel_size_t_void_ptr_size_t_ptr *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"clGetMemAllocInfoINTEL",&local_71);
    getExtensionFunctionAddress(in_stack_00000408,in_stack_00000400,in_stack_000003f8);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  local_80 = CLIntercept::dispatchX
                       (in_stack_fffffffffffffe38,(cl_platform_id)in_stack_fffffffffffffe30);
  if (local_80->clGetMemAllocInfoINTEL !=
      (_func_cl_int_cl_context_void_ptr_cl_mem_info_intel_size_t_void_ptr_size_t_ptr *)0x0) {
    local_88 = (cl_context)0x0;
    pcVar2 = dispatch(in_RDI);
    (*pcVar2->clGetCommandQueueInfo)(local_18,0x1090,8,&local_88,(size_t *)0x0);
    if (local_88 != (cl_context)0x0) {
      local_8c = 0x4196;
      (*local_80->clGetMemAllocInfoINTEL)(local_88,local_20,0x419a,4,&local_8c,(size_t *)0x0);
      if (local_8c == 0x4197) {
        std::__cxx11::string::operator+=(local_30,"H");
      }
      else if (local_8c == 0x4198) {
        std::__cxx11::string::operator+=(local_30,"D");
      }
      else if (local_8c == 0x4199) {
        std::__cxx11::string::operator+=(local_30,"S");
      }
      else {
        std::__cxx11::string::operator+=(local_30,"M");
      }
      std::__cxx11::string::reserve((ulong)in_stack_00000008);
      std::__cxx11::string::operator=(in_stack_00000008,local_10);
      std::__cxx11::string::operator+=(in_stack_00000008,"( ");
      std::__cxx11::string::operator+=(in_stack_00000008,local_30);
      if ((local_28 != 0) &&
         (pSVar3 = config(in_RDI), (pSVar3->DevicePerformanceTimeTransferTracking & 1U) != 0)) {
        __s = local_198;
        snprintf(__s,0x100,"; %zu bytes",local_28);
        std::__cxx11::string::operator+=(in_stack_00000008,__s);
      }
      std::__cxx11::string::operator+=(in_stack_00000008," )");
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1fdea6);
  return;
}

Assistant:

void CLIntercept::getTimingTagsMemfill(
    const char* functionName,
    const cl_command_queue queue,
    const void* dst,
    const size_t size,
    std::string& hostTag,
    std::string& deviceTag )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_platform_id  platform = getPlatform(queue);

    // If we don't have a function pointer for clGetMemAllocINFO, try to
    // get one.  It's possible that the function pointer exists but
    // the application hasn't queried for it yet, in which case it won't
    // be installed into the dispatch table.
    if( dispatchX(platform).clGetMemAllocInfoINTEL == NULL )
    {
        getExtensionFunctionAddress(
            platform,
            "clGetMemAllocInfoINTEL" );
    }

    const auto& dispatchX = this->dispatchX(platform);
    if( dispatchX.clGetMemAllocInfoINTEL != NULL )
    {
        cl_context  context = NULL;
        dispatch().clGetCommandQueueInfo(
            queue,
            CL_QUEUE_CONTEXT,
            sizeof( context ),
            &context,
            NULL );

        if( context )
        {
            cl_unified_shared_memory_type_intel dstType = CL_MEM_TYPE_UNKNOWN_INTEL;
            dispatchX.clGetMemAllocInfoINTEL(
                context,
                dst,
                CL_MEM_ALLOC_TYPE_INTEL,
                sizeof(dstType),
                &dstType,
                NULL );
            switch( dstType )
            {
            case CL_MEM_TYPE_DEVICE_INTEL:  hostTag += "D"; break;
            case CL_MEM_TYPE_HOST_INTEL:    hostTag += "H"; break;
            case CL_MEM_TYPE_SHARED_INTEL:  hostTag += "S"; break;
            default:                        hostTag += "M"; break;
            }

            deviceTag.reserve(128);
            deviceTag = functionName;
            deviceTag += "( ";
            deviceTag += hostTag;
            if( size && config().DevicePerformanceTimeTransferTracking )
            {
                char    s[256];
                CLI_SPRINTF( s, 256, "; %zu bytes", size );
                deviceTag += s;
            }
            deviceTag += " )";
        }
    }
}